

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb__arrsize_(void **pp,int size,int limit,int len)

{
  void *pvVar1;
  int *piVar2;
  int *__ptr;
  int iVar3;
  size_t __size;
  int iVar4;
  
  pvVar1 = *pp;
  if (pvVar1 == (void *)0x0) {
    if (len == 0 && size == 0) {
      return;
    }
    __ptr = (int *)stb__arr_malloc(size * limit + 0x10);
    __ptr[1] = limit;
    *__ptr = len;
    __ptr[2] = (uint)(stb__arr_context != (void *)0x0);
    __ptr[3] = 0x51bada7b;
  }
  else {
    __ptr = (int *)((long)pvVar1 + -0x10);
    *(int *)((long)pvVar1 + -0x10) = len;
    iVar3 = *(int *)((long)pvVar1 + -0xc);
    if (iVar3 < limit) {
      iVar4 = iVar3 * 2;
      if (iVar3 * 2 <= limit) {
        iVar4 = limit;
      }
      if (iVar3 < 4) {
        iVar4 = limit;
      }
      __size = (long)(size * iVar4) + 0x10;
      if (*(int *)((long)pvVar1 + -8) == 0) {
        piVar2 = (int *)realloc(__ptr,__size);
      }
      else {
        piVar2 = (int *)stb_realloc(__ptr,__size);
      }
      if (piVar2 != (int *)0x0) {
        piVar2[1] = iVar4;
        __ptr = piVar2;
      }
    }
  }
  iVar3 = __ptr[1];
  if (*__ptr < __ptr[1]) {
    iVar3 = *__ptr;
  }
  *__ptr = iVar3;
  *pp = __ptr + 4;
  return;
}

Assistant:

static void stb__arrsize_(void **pp, int size, int limit, int len  STB__PARAMS)
{
   void *p = *pp;
   stb__arr *a;
   stb_arr_check2(p);
   if (p == NULL) {
      if (len == 0 && size == 0) return;
      a = (stb__arr *) stb__arr_malloc(sizeof(*a) + size*limit);
      a->limit = limit;
      a->len   = len;
      a->stb_malloc = !!stb__arr_context;
      a->signature = stb_arr_signature;
   } else {
      a = stb_arrhead2(p);
      a->len = len;
      if (a->limit < limit) {
         void *p;
         if (a->limit >= 4 && limit < a->limit * 2)
            limit = a->limit * 2;
         if (a->stb_malloc)
            p = stb_realloc(a, sizeof(*a) + limit*size);
         else
            #ifdef STB_MALLOC_WRAPPER
            p = stb__realloc(a, sizeof(*a) + limit*size, file, line);
            #else
            p = realloc(a, sizeof(*a) + limit*size);
            #endif
         if (p) {
            a = (stb__arr *) p;
            a->limit = limit;
         } else {
            // throw an error!
         }
      }
   }
   a->len   = stb_min(a->len, a->limit);
   *pp = a+1;
}